

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

long __thiscall
mkvparser::ContentEncoding::ParseContentEncodingEntry
          (ContentEncoding *this,longlong start,longlong size,IMkvReader *pReader)

{
  long lVar1;
  ContentCompression **ppCVar2;
  ContentEncryption **ppCVar3;
  ContentEncryption *encryption;
  unsigned_long_long uVar4;
  ulong uVar5;
  ContentEncoding *pCVar6;
  long lVar7;
  long lVar8;
  long stop;
  longlong pos;
  longlong size_1;
  longlong id;
  long local_68;
  long local_60;
  ContentEncoding *local_58;
  IMkvReader *local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  local_58 = this;
  local_50 = pReader;
  if (pReader == (IMkvReader *)0x0) {
    __assert_fail("pReader",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x106c,
                  "long mkvparser::ContentEncoding::ParseContentEncodingEntry(long long, long long, IMkvReader *)"
                 );
  }
  stop = size + start;
  local_48 = 0;
  local_40 = 0;
  local_68 = start;
  while (pCVar6 = local_58, local_68 < stop) {
    lVar1 = ParseElementHeader(local_50,&local_68,stop,&local_38,&local_60);
    if (lVar1 < 0) {
      return lVar1;
    }
    if (local_38 == 0x5035) {
      if (0x7ffffffe < (long)local_48) {
        return -1;
      }
      local_48 = local_48 + 1;
    }
    else if (local_38 == 0x5034) {
      if (0x7ffffffe < (long)local_40) {
        return -1;
      }
      local_40 = local_40 + 1;
    }
    local_68 = local_68 + local_60;
    if (stop < local_68) {
      return -2;
    }
  }
  if ((long)local_40 < 1 && (long)local_48 < 1) {
    return -1;
  }
  if (0 < (long)local_40) {
    uVar5 = local_40 * 8;
    if (0x1fffffffffffffff < local_40) {
      uVar5 = 0xffffffffffffffff;
    }
    ppCVar2 = (ContentCompression **)operator_new__(uVar5,(nothrow_t *)&std::nothrow);
    pCVar6->compression_entries_ = ppCVar2;
    if (ppCVar2 == (ContentCompression **)0x0) {
      return -1;
    }
    local_58->compression_entries_end_ = ppCVar2;
  }
  pCVar6 = local_58;
  lVar1 = start;
  if (0 < (long)local_48) {
    uVar5 = 0xffffffffffffffff;
    if (local_48 < 0x2000000000000000) {
      uVar5 = local_48 * 8;
    }
    ppCVar3 = (ContentEncryption **)operator_new__(uVar5,(nothrow_t *)&std::nothrow);
    pCVar6->encryption_entries_ = ppCVar3;
    if (ppCVar3 == (ContentEncryption **)0x0) {
      if (pCVar6->compression_entries_ != (ContentCompression **)0x0) {
        operator_delete__(pCVar6->compression_entries_);
      }
      pCVar6->compression_entries_ = (ContentCompression **)0x0;
      return -1;
    }
    pCVar6->encryption_entries_end_ = ppCVar3;
    lVar1 = start;
  }
  do {
    local_68 = lVar1;
    if (stop <= local_68) {
      return (ulong)(local_68 == stop) * 2 + -2;
    }
    lVar1 = ParseElementHeader(local_50,&local_68,stop,&local_38,&local_60);
    lVar8 = local_60;
    lVar7 = local_68;
    if (lVar1 < 0) {
      return lVar1;
    }
    switch(local_38) {
    case 0x5031:
      uVar4 = UnserializeUInt(local_50,local_68,local_60);
      local_58->encoding_order_ = uVar4;
      break;
    case 0x5032:
      uVar4 = UnserializeUInt(local_50,local_68,local_60);
      local_58->encoding_scope_ = uVar4;
      if (uVar4 == 0) {
        return -1;
      }
      break;
    case 0x5033:
      uVar4 = UnserializeUInt(local_50,local_68,local_60);
      local_58->encoding_type_ = uVar4;
      break;
    case 0x5034:
      pCVar6 = (ContentEncoding *)0x18;
      encryption = (ContentEncryption *)operator_new(0x18,(nothrow_t *)&std::nothrow);
      lVar8 = local_60;
      lVar7 = local_68;
      if (encryption == (ContentEncryption *)0x0) {
        return -1;
      }
      encryption->algo = 0;
      encryption->key_id = (uchar *)0x0;
      encryption->key_id_len = 0;
      lVar1 = ParseCompressionEntry
                        (pCVar6,local_68,local_60,local_50,(ContentCompression *)encryption);
      if (lVar1 != 0) {
        if (encryption->key_id != (uchar *)0x0) {
          operator_delete__(encryption->key_id);
        }
LAB_00128789:
        operator_delete(encryption);
        return lVar1;
      }
      if ((long)local_40 < 1) {
        __assert_fail("compression_count > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x10bc,
                      "long mkvparser::ContentEncoding::ParseContentEncodingEntry(long long, long long, IMkvReader *)"
                     );
      }
      ppCVar3 = (ContentEncryption **)local_58->compression_entries_end_;
      local_58->compression_entries_end_ = (ContentCompression **)(ppCVar3 + 1);
      goto LAB_001286d6;
    case 0x5035:
      pCVar6 = (ContentEncoding *)0x50;
      encryption = (ContentEncryption *)operator_new(0x50,(nothrow_t *)&std::nothrow);
      lVar8 = local_60;
      lVar7 = local_68;
      if (encryption == (ContentEncryption *)0x0) {
        return -1;
      }
      encryption->sig_key_id_len = 0;
      encryption->sig_algo = 0;
      encryption->signature_len = 0;
      encryption->sig_key_id = (uchar *)0x0;
      encryption->key_id_len = 0;
      encryption->signature = (uchar *)0x0;
      encryption->algo = 0;
      encryption->key_id = (uchar *)0x0;
      encryption->sig_hash_algo = 0;
      (encryption->aes_settings).cipher_mode = 1;
      lVar1 = ParseEncryptionEntry(pCVar6,local_68,local_60,local_50,encryption);
      if (lVar1 != 0) {
        ContentEncryption::~ContentEncryption(encryption);
        goto LAB_00128789;
      }
      if ((long)local_48 < 1) {
        __assert_fail("encryption_count > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x10c9,
                      "long mkvparser::ContentEncoding::ParseContentEncodingEntry(long long, long long, IMkvReader *)"
                     );
      }
      ppCVar3 = local_58->encryption_entries_end_;
      local_58->encryption_entries_end_ = ppCVar3 + 1;
LAB_001286d6:
      *ppCVar3 = encryption;
    }
    lVar1 = lVar7 + lVar8;
    if (stop < lVar7 + lVar8) {
      return -2;
    }
  } while( true );
}

Assistant:

long ContentEncoding::ParseContentEncodingEntry(long long start, long long size,
                                                IMkvReader* pReader) {
  assert(pReader);

  long long pos = start;
  const long long stop = start + size;

  // Count ContentCompression and ContentEncryption elements.
  long long compression_count = 0;
  long long encryption_count = 0;

  while (pos < stop) {
    long long id, size;
    const long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvContentCompression) {
      ++compression_count;
      if (compression_count > INT_MAX)
        return E_PARSE_FAILED;
    }

    if (id == libwebm::kMkvContentEncryption) {
      ++encryption_count;
      if (encryption_count > INT_MAX)
        return E_PARSE_FAILED;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (compression_count <= 0 && encryption_count <= 0)
    return -1;

  if (compression_count > 0) {
    compression_entries_ = new (std::nothrow)
        ContentCompression*[static_cast<size_t>(compression_count)];
    if (!compression_entries_)
      return -1;
    compression_entries_end_ = compression_entries_;
  }

  if (encryption_count > 0) {
    encryption_entries_ = new (std::nothrow)
        ContentEncryption*[static_cast<size_t>(encryption_count)];
    if (!encryption_entries_) {
      delete[] compression_entries_;
      compression_entries_ = NULL;
      return -1;
    }
    encryption_entries_end_ = encryption_entries_;
  }

  pos = start;
  while (pos < stop) {
    long long id, size;
    long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvContentEncodingOrder) {
      encoding_order_ = UnserializeUInt(pReader, pos, size);
    } else if (id == libwebm::kMkvContentEncodingScope) {
      encoding_scope_ = UnserializeUInt(pReader, pos, size);
      if (encoding_scope_ < 1)
        return -1;
    } else if (id == libwebm::kMkvContentEncodingType) {
      encoding_type_ = UnserializeUInt(pReader, pos, size);
    } else if (id == libwebm::kMkvContentCompression) {
      ContentCompression* const compression =
          new (std::nothrow) ContentCompression();
      if (!compression)
        return -1;

      status = ParseCompressionEntry(pos, size, pReader, compression);
      if (status) {
        delete compression;
        return status;
      }
      assert(compression_count > 0);
      *compression_entries_end_++ = compression;
    } else if (id == libwebm::kMkvContentEncryption) {
      ContentEncryption* const encryption =
          new (std::nothrow) ContentEncryption();
      if (!encryption)
        return -1;

      status = ParseEncryptionEntry(pos, size, pReader, encryption);
      if (status) {
        delete encryption;
        return status;
      }
      assert(encryption_count > 0);
      *encryption_entries_end_++ = encryption;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;
  return 0;
}